

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker,SW_FT_Int side)

{
  SW_FT_Error SVar1;
  int in_ESI;
  SW_FT_Angle *in_RDI;
  SW_FT_StrokeBorder border;
  SW_FT_Error error;
  SW_FT_Fixed radius;
  SW_FT_Angle rotate;
  SW_FT_Angle total;
  undefined4 in_stack_00000028;
  SW_FT_Vector *in_stack_00000038;
  SW_FT_StrokeBorder in_stack_00000040;
  
  SW_FT_Angle_Diff(*in_RDI,in_RDI[1]);
  SVar1 = ft_stroke_border_arcto
                    (in_stack_00000040,in_stack_00000038,(SW_FT_Fixed)stroker,
                     CONCAT44(side,in_stack_00000028),total);
  *(undefined1 *)(in_RDI + (long)in_ESI * 5 + 0x11) = 0;
  return SVar1;
}

Assistant:

static SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker, SW_FT_Int side)
{
    SW_FT_Angle        total, rotate;
    SW_FT_Fixed        radius = stroker->radius;
    SW_FT_Error        error = 0;
    SW_FT_StrokeBorder border = stroker->borders + side;

    rotate = SW_FT_SIDE_TO_ROTATE(side);

    total = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == SW_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}